

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphMaker.cc
# Opt level: O0

__uint128_t * kmer_reverse128(__uint128_t *__return_storage_ptr__,__uint128_t kmer,uint8_t k)

{
  uint uVar1;
  byte in_DL;
  undefined7 in_register_00000031;
  __uint128_t nuc;
  undefined4 local_6c;
  __uint128_t *p_Stack_68;
  int pos;
  __uint128_t rkmer;
  __uint128_t old_kmer;
  uint8_t k_local;
  __uint128_t kmer_local;
  
  old_kmer._0_8_ = CONCAT71(in_register_00000031,k);
  p_Stack_68 = (__uint128_t *)0x0;
  rkmer._8_8_ = __return_storage_ptr__;
  for (local_6c = 0; local_6c < (int)(uint)in_DL; local_6c = local_6c + 1) {
    uVar1 = ~rkmer._8_4_;
    rkmer._8_8_ = (__uint128_t *)((ulong)old_kmer << 0x3e | (ulong)rkmer._8_8_ >> 2);
    old_kmer._0_8_ = (ulong)old_kmer >> 2;
    p_Stack_68 = (__uint128_t *)((long)p_Stack_68 * 4 + (ulong)(uVar1 & 3));
  }
  return p_Stack_68;
}

Assistant:

__uint128_t kmer_reverse128(__uint128_t kmer, uint8_t k) {
    __uint128_t old_kmer=kmer;
    __uint128_t rkmer=0;
    for (int pos=0;pos<k;++pos) {
        __uint128_t nuc=3-(old_kmer%4);
        old_kmer>>=2;
        rkmer<<=2;
        rkmer+=nuc;
    }
    return rkmer;
}